

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O0

SpecifyBlockSymbol *
slang::ast::SpecifyBlockSymbol::fromSyntax
          (Scope *scope,SpecifyBlockSyntax *syntax,
          SmallVector<const_slang::ast::Symbol_*,_5UL> *implicitSymbols)

{
  bool bVar1;
  SyntaxNode *in_RSI;
  Scope *in_RDI;
  SystemTimingCheckSymbol *timingCheck;
  Symbol *member_1;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  MemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::MemberSyntax> *__range2;
  SpecifyBlockSymbol *result;
  Compilation *comp;
  SyntaxNode *in_stack_000004d8;
  Scope *in_stack_000004e0;
  Symbol *in_stack_fffffffffffffe78;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_fffffffffffffe80;
  Compilation *in_stack_fffffffffffffe88;
  BumpAllocator *in_stack_fffffffffffffe90;
  Symbol *local_120;
  __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
  local_40;
  SyntaxNode *local_38;
  SourceLocation local_30;
  SpecifyBlockSymbol *local_28;
  Compilation *local_20;
  SyntaxNode *local_10;
  
  local_10 = in_RSI;
  local_20 = Scope::getCompilation(in_RDI);
  local_30 = parsing::Token::location((Token *)&local_10[3].parent);
  local_28 = BumpAllocator::
             emplace<slang::ast::SpecifyBlockSymbol,slang::ast::Compilation&,slang::SourceLocation>
                       (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                        (SourceLocation *)in_stack_fffffffffffffe80);
  Symbol::setSyntax(&local_28->super_Symbol,local_10);
  local_38 = local_10 + 4;
  local_40._M_current =
       (MemberSyntax **)
       std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                  in_stack_fffffffffffffe78);
  std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
             in_stack_fffffffffffffe88);
  while (bVar1 = __gnu_cxx::
                 operator==<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe80,
                            (__normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffe78), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator*(&local_40);
    Scope::addMembers(in_stack_000004e0,in_stack_000004d8);
    __gnu_cxx::
    __normal_iterator<slang::syntax::MemberSyntax_**,_std::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_40);
  }
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
              *)in_stack_fffffffffffffe90);
  for (local_120 = Scope::getFirstMember(&local_28->super_Scope); local_120 != (Symbol *)0x0;
      local_120 = Symbol::getNextSibling(local_120)) {
    if (local_120->kind == Specparam) {
      BumpAllocator::emplace<slang::ast::TransparentMemberSymbol,slang::ast::Symbol_const&>
                ((BumpAllocator *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                (in_stack_fffffffffffffe80,(Symbol **)in_stack_fffffffffffffe78);
    }
    else if (local_120->kind == SystemTimingCheck) {
      Symbol::as<slang::ast::SystemTimingCheckSymbol>((Symbol *)0x526574);
      createImplicitNets((SystemTimingCheckSymbol *)implicitNetNames.super_Storage.buffer._40_8_,
                         (SystemTimingCheckDef *)implicitNetNames.super_Storage.buffer._32_8_,
                         (Scope *)implicitNetNames.super_Storage.buffer._24_8_,
                         (SmallVector<const_slang::ast::Symbol_*,_5UL> *)
                         implicitNetNames.super_Storage.buffer._16_8_,
                         (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                          *)implicitNetNames.super_Storage.buffer._8_8_);
    }
  }
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::~SmallSet((SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *)0x5265e7);
  return local_28;
}

Assistant:

SpecifyBlockSymbol& SpecifyBlockSymbol::fromSyntax(const Scope& scope,
                                                   const SpecifyBlockSyntax& syntax,
                                                   SmallVector<const Symbol*>& implicitSymbols) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<SpecifyBlockSymbol>(comp, syntax.specify.location());
    result->setSyntax(syntax);

    for (auto member : syntax.items)
        result->addMembers(*member);

    SmallSet<std::string_view, 8> implicitNetNames;

    for (auto member = result->getFirstMember(); member; member = member->getNextSibling()) {
        if (member->kind == SymbolKind::Specparam) {
            // specparams inside specify blocks get visibility in the parent scope as well.
            implicitSymbols.push_back(comp.emplace<TransparentMemberSymbol>(*member));
        }
        else if (member->kind == SymbolKind::SystemTimingCheck) {
            // some system timing checks can create implicit nets
            auto& timingCheck = member->as<SystemTimingCheckSymbol>();
            createImplicitNets(timingCheck, timingCheck.def, scope, implicitSymbols,
                               implicitNetNames);
        }
    }

    return *result;
}